

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderIndexingTests.cpp
# Opt level: O2

void vkt::sr::anon_unknown_0::evalSubscriptMat2(ShaderEvalContext *c)

{
  Vector<float,_2> local_50;
  Vector<float,_2> local_48;
  Vector<float,_2> local_40;
  Vector<float,_2> local_38;
  VecAccess<float,_4,_2> local_30;
  
  local_50.m_data = *(float (*) [2])(c->coords).m_data;
  local_48.m_data[1] = (c->coords).m_data[2];
  local_48.m_data[0] = local_50.m_data[1];
  tcu::operator*(0.5,&local_48);
  tcu::operator+(&local_50,&local_40);
  local_30.m_vector = &c->color;
  local_30.m_index[0] = 0;
  local_30.m_index[1] = 1;
  tcu::VecAccess<float,_4,_2>::operator=(&local_30,&local_38);
  return;
}

Assistant:

void evalSubscriptMat2		(ShaderEvalContext& c) { c.color.xy()	= c.coords.swizzle(0,1) + 0.5f*c.coords.swizzle(1,2); }